

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O2

void __thiscall QSplitter::setOrientation(QSplitter *this,Orientation orientation)

{
  QSplitterPrivate *this_00;
  bool bVar1;
  QSizePolicy policy;
  int i;
  ulong uVar2;
  long in_FS_OFFSET;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSplitterPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  if (this_00->orient != orientation) {
    bVar1 = QWidget::testAttribute_helper((QWidget *)this,WA_WState_OwnSizePolicy);
    if (!bVar1) {
      local_2c.bits = (Bits)QWidget::sizePolicy((QWidget *)this);
      policy.field_0 =
           (anon_union_4_2_313b0b05_for_QSizePolicy_1)QSizePolicy::Bits::transposed(&local_2c.bits);
      QWidget::setSizePolicy((QWidget *)this,policy);
      QWidget::setAttribute((QWidget *)this,WA_WState_OwnSizePolicy,false);
    }
    this_00->orient = orientation;
    for (uVar2 = 0; uVar2 < (ulong)(this_00->list).d.size; uVar2 = uVar2 + 1) {
      QSplitterHandle::setOrientation((this_00->list).d.ptr[uVar2]->handle,orientation);
    }
    QSplitterPrivate::recalc
              (this_00,SUB21((ushort)(short)((this->super_QFrame).super_QWidget.data)->
                                            widget_attributes >> 0xf,0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplitter::setOrientation(Qt::Orientation orientation)
{
    Q_D(QSplitter);
    if (d->orient == orientation)
        return;

    if (!testAttribute(Qt::WA_WState_OwnSizePolicy)) {
        setSizePolicy(sizePolicy().transposed());
        setAttribute(Qt::WA_WState_OwnSizePolicy, false);
    }

    d->orient = orientation;

    for (int i = 0; i < d->list.size(); ++i) {
        QSplitterLayoutStruct *s = d->list.at(i);
        s->handle->setOrientation(orientation);
    }
    d->recalc(isVisible());
}